

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_insert_nextto(lyd_node *sibling,lyd_node *node,int before,int invalidate)

{
  LYS_NODE LVar1;
  lyd_node *plVar2;
  long lVar3;
  int iVar4;
  lys_node *plVar5;
  lys_node *node_00;
  LY_ERR *pLVar6;
  lyd_node *plVar7;
  char *pcVar8;
  lyd_node **pplVar9;
  lyd_node **pplVar10;
  lyd_node *node_01;
  lyd_node *plVar11;
  lyd_node *node_02;
  lyd_node *local_70;
  lyd_node **local_68;
  lyd_node *local_60;
  lyd_node *local_40;
  uint local_34;
  
  if (sibling == (lyd_node *)0x0) {
    __assert_fail("sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xe9e,"int lyd_insert_nextto(struct lyd_node *, struct lyd_node *, int, int)");
  }
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xe9f,"int lyd_insert_nextto(struct lyd_node *, struct lyd_node *, int, int)");
  }
  if (sibling == node) {
    return 0;
  }
  for (plVar5 = lys_parent(sibling->schema); plVar5 != (lys_node *)0x0; plVar5 = lys_parent(plVar5))
  {
    if ((plVar5->nodetype & (LYS_ACTION|LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
        LYS_UNKNOWN) goto LAB_0015fbfb;
  }
  plVar5 = (lys_node *)0x0;
LAB_0015fbfb:
  node_00 = node->schema;
  do {
    node_00 = lys_parent(node_00);
    if (node_00 == (lys_node *)0x0) {
      node_00 = (lys_node *)0x0;
      break;
    }
  } while ((node_00->nodetype & (LYS_ACTION|LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER))
           == LYS_UNKNOWN);
  if (plVar5 != node_00) {
    pLVar6 = ly_errno_location();
    *pLVar6 = LY_EINVAL;
    return 1;
  }
  local_34 = 0;
  if (invalidate != 0) {
    plVar7 = node;
    if (node->parent == sibling->parent) {
      iVar4 = lyp_is_rpc_action(node->schema);
      if (iVar4 != 0) goto LAB_0015fc81;
      if (node->parent == (lyd_node *)0x0) goto LAB_0015fc56;
    }
    else {
      iVar4 = 0;
      if (node->parent == (lyd_node *)0x0) {
LAB_0015fc56:
        do {
          plVar7 = plVar7->prev;
          if (plVar7 == node) break;
        } while (plVar7 != sibling);
        local_34 = (uint)(plVar7 == node);
      }
      else {
LAB_0015fc81:
        local_34 = iVar4 + 1;
      }
    }
  }
  plVar7 = node->prev;
  plVar2 = node->parent;
  if ((plVar2 == (lyd_node *)0x0) && (plVar7->next == (lyd_node *)0x0)) {
    local_70 = (lyd_node *)0x0;
    local_60 = (lyd_node *)0x0;
  }
  else {
    local_70 = (lyd_node *)0x0;
    if (plVar7 != node) {
      local_70 = plVar7;
    }
    local_60 = node->next;
    lyd_unlink_internal(node,local_34);
  }
  plVar7 = sibling;
  if (sibling->parent == (lyd_node *)0x0) {
    do {
      local_40 = plVar7;
      plVar7 = local_40->prev;
    } while (local_40->prev->next != (lyd_node *)0x0);
  }
  else {
    local_40 = sibling->parent->child;
  }
  plVar7 = node;
  do {
    node_01 = plVar7;
    plVar7 = node_01->next;
    node_01->parent = sibling->parent;
    if (((local_34 != 0) && (lyd_insert_setinvalid(node_01), local_34 == 1)) &&
       (iVar4 = lyv_multicases(node_01,(lys_node *)0x0,&local_40,1,sibling), iVar4 == 2)) {
      pcVar8 = ly_errpath();
      ly_vlog(LYE_SPEC,LY_VLOG_LYD,sibling,
              "Insert request refers node (%s) that is going to be auto-deleted.",pcVar8);
      goto LAB_0015ff01;
    }
    plVar5 = node_01->schema;
    LVar1 = plVar5->nodetype;
    plVar11 = local_40;
    if (LVar1 == LYS_CONTAINER) {
      lVar3._0_2_ = plVar5[1].flags;
      lVar3._2_1_ = plVar5[1].ext_size;
      lVar3._3_1_ = plVar5[1].iffeature_size;
      lVar3._4_1_ = plVar5[1].padding[0];
      lVar3._5_1_ = plVar5[1].padding[1];
      lVar3._6_1_ = plVar5[1].padding[2];
      lVar3._7_1_ = plVar5[1].padding[3];
      if (local_40 != (lyd_node *)0x0 && lVar3 == 0) goto LAB_0015fdf2;
    }
    else if (LVar1 == LYS_LEAF) {
      for (; plVar11 != (lyd_node *)0x0; plVar11 = plVar11->next) {
LAB_0015fdf2:
        if (plVar11->schema == plVar5) {
          if (((plVar11->field_0x9 & 1) != 0) || ((node_01->field_0x9 & 1) != 0)) {
            if (plVar11 == sibling) goto LAB_0015fe5d;
            if (plVar11 == local_40) {
              local_40 = plVar11->next;
            }
            lyd_free(plVar11);
          }
          break;
        }
      }
    }
    else if (LVar1 == LYS_LEAFLIST) {
LAB_0015fd61:
      node_02 = plVar11;
      if (node_02 != (lyd_node *)0x0) {
        plVar11 = node_02->next;
        if (node_02->schema == node_01->schema) {
          if ((node_01->field_0x9 & 1) == 0) {
            if ((node_02->field_0x9 & 1) == 0) goto LAB_0015fd61;
          }
          else if (((node_02->field_0x9 & 1) != 0) &&
                  (((node_02->schema->flags & 1) == 0 ||
                   (iVar4 = strcmp((char *)node_02->child,(char *)node_01->child), iVar4 != 0))))
          goto LAB_0015fd61;
          if (node_02 == sibling) goto LAB_0015fe5d;
          if (node_02 == local_40) {
            local_40 = plVar11;
          }
          lyd_free(node_02);
        }
        goto LAB_0015fd61;
      }
    }
  } while (plVar7 != (lyd_node *)0x0);
  pplVar9 = &node_01->next;
  if (before == 0) {
    local_68 = &local_40;
    if (sibling->next != (lyd_node *)0x0) {
      *pplVar9 = sibling->next;
      local_68 = &sibling->next;
    }
    (*local_68)->prev = node_01;
    sibling->next = node;
    pplVar9 = &node->prev;
    goto LAB_0015ff47;
  }
  plVar7 = sibling->prev;
  if (plVar7->next == (lyd_node *)0x0) {
    if (sibling->parent != (lyd_node *)0x0) {
      pplVar10 = &sibling->parent->child;
      goto LAB_0015ff3c;
    }
  }
  else {
    pplVar10 = &plVar7->next;
LAB_0015ff3c:
    *pplVar10 = node;
  }
  node->prev = plVar7;
  sibling->prev = node_01;
LAB_0015ff47:
  *pplVar9 = sibling;
  if (invalidate == 0) {
    return 0;
  }
  do {
    check_leaf_list_backlinks(node,0);
    if (node == node_01) {
      return 0;
    }
    node = node->next;
  } while (node != (lyd_node *)0x0);
  return 0;
LAB_0015fe5d:
  pLVar6 = ly_errno_location();
  *pLVar6 = LY_EINVAL;
  pLVar6 = ly_errno_location();
  *pLVar6 = LY_EINVAL;
  pcVar8 = _lyd_path(sibling,0);
  ly_log(LY_LLERR,"Insert request refers node (%s) that is going to be auto-deleted.",pcVar8);
  free(pcVar8);
LAB_0015ff01:
  if (local_70 != (lyd_node *)0x0) {
    lyd_insert_after(local_70,node);
    return 1;
  }
  if (local_60 != (lyd_node *)0x0) {
    lyd_insert_before(local_60,node);
    return 1;
  }
  if (plVar2 == (lyd_node *)0x0) {
    return 1;
  }
  plVar2->child = node;
  node->parent = plVar2;
  return 1;
}

Assistant:

int
lyd_insert_nextto(struct lyd_node *sibling, struct lyd_node *node, int before, int invalidate)
{
    struct lys_node *par1, *par2;
    struct lyd_node *iter, *start = NULL, *ins, *next1, *next2, *last;
    struct lyd_node *orig_parent = NULL, *orig_prev = NULL, *orig_next = NULL;
    int invalid = 0;
    char *str;

    assert(sibling);
    assert(node);

    if (sibling == node) {
        return EXIT_SUCCESS;
    }

    /* check placing the node to the appropriate place according to the schema */
    for (par1 = lys_parent(sibling->schema);
         par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_ACTION | LYS_NOTIF));
         par1 = lys_parent(par1));
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_ACTION | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (invalidate && ((node->parent != sibling->parent) || (invalid = lyp_is_rpc_action(node->schema)) || !node->parent)) {
        /* a) it is not just moving under a parent node (invalid = 1) or
         * b) it is in an RPC where nodes order matters (invalid = 2) or
         * c) it is top-level where we don't know if it is the same tree (invalid = 1),
         * so the validation will be necessary */
        if (!node->parent && !invalid) {
            /* c) search in siblings */
            for (iter = node->prev; iter != node; iter = iter->prev) {
                if (iter == sibling) {
                    break;
                }
            }
            if (iter == node) {
                /* node and siblings are not currently in the same data tree */
                invalid++;
            }
        } else { /* a) and b) */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* remember the original position to be able to revert
         * unlink in case of error */
        orig_parent = node->parent;
        if (node->prev != node) {
            orig_prev = node->prev;
        }
        orig_next = node->next;
        lyd_unlink_internal(node, invalid);
    }

    /* find first sibling node */
    if (sibling->parent) {
        start = sibling->parent->child;
    } else {
        for (start = sibling; start->prev->next; start = start->prev);
    }

    /* process the nodes one by one to clean the current tree */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        ins->parent = sibling->parent;
        last = ins;

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }

        if (invalid == 1) {
            /* auto delete nodes from other cases */
            if (lyv_multicases(ins, NULL, &start, 1, sibling) == 2) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYD, sibling, "Insert request refers node (%s) that is going to be auto-deleted.",
                       ly_errpath());
                goto error;
            }
        }

        /* try to find previously present default instance to remove because of
         * inserting the specified node */
        if (ins->schema->nodetype == LYS_LEAFLIST) {
            LY_TREE_FOR_SAFE(start, next2, iter) {
                if (iter->schema == ins->schema) {
                    if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                       !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                              ((struct lyd_node_leaf_list *)ins)->value_str))))
                            || (!ins->dflt && iter->dflt)) {
                        /* iter will get deleted */
                        if (iter == sibling) {
                            ly_errno = LY_EINVAL;
                            str = NULL;
                            LOGERR(LY_EINVAL, "Insert request refers node (%s) that is going to be auto-deleted.",
                                str = lyd_path(sibling));
                            free(str);
                            goto error;
                        }
                        if (iter == start) {
                            start = next2;
                        }
                        lyd_free(iter);
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF ||
                (ins->schema->nodetype == LYS_CONTAINER && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (iter->dflt || ins->dflt) {
                        /* iter gets deleted */
                        if (iter == sibling) {
                            ly_errno = LY_EINVAL;
                            str = NULL;
                            LOGERR(LY_EINVAL, "Insert request refers node (%s) that is going to be auto-deleted.",
                                str = lyd_path(sibling));
                            free(str);
                            goto error;
                        }
                        if (iter == start) {
                            start = iter->next;
                        }
                        lyd_free(iter);
                    }
                    break;
                }
            }
        }
    }

    /* insert the (list of) node(s) to the specified position */
    if (before) {
        if (sibling->prev->next) {
            /* adding into a middle */
            sibling->prev->next = node;
        } else if (sibling->parent) {
            /* at the beginning */
            sibling->parent->child = node;
        }
        node->prev = sibling->prev;
        sibling->prev = last;
        last->next = sibling;
    } else { /* after */
        if (sibling->next) {
            /* adding into a middle - fix the prev pointer of the node after inserted nodes */
            last->next = sibling->next;
            sibling->next->prev = last;
        } else {
            /* at the end - fix the prev pointer of the first node */
            start->prev = last;
        }
        sibling->next = node;
        node->prev = sibling;
    }

    if (invalidate) {
        LY_TREE_FOR(node, next1) {
            check_leaf_list_backlinks(next1, 0);
            if (next1 == last) {
                break;
            }
        }
    }


    return EXIT_SUCCESS;

error:
    /* insert back to the original position */
    if (orig_prev) {
        lyd_insert_after(orig_prev, node);
    } else if (orig_next) {
        lyd_insert_before(orig_next, node);
    } else if (orig_parent) {
        /* there were no siblings */
        orig_parent->child = node;
        node->parent = orig_parent;
    }
    return EXIT_FAILURE;
}